

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O3

Var Js::JavascriptOperators::OP_LdHomeObj(Var scriptFunction,ScriptContext *scriptContext)

{
  bool bVar1;
  ThreadContext *pTVar2;
  bool bVar3;
  int iVar4;
  ScriptFunction *pSVar5;
  undefined4 extraout_var;
  RecyclableObject *pRVar6;
  
  pTVar2 = scriptContext->threadContext;
  bVar1 = pTVar2->noJsReentrancy;
  pTVar2->noJsReentrancy = true;
  bVar3 = VarIs<Js::ScriptFunction>(scriptFunction);
  if (bVar3) {
    bVar3 = ThreadContext::IsOnStack(scriptFunction);
    if (!bVar3) {
      pSVar5 = UnsafeVarTo<Js::ScriptFunction>(scriptFunction);
      iVar4 = (*(pSVar5->super_ScriptFunctionBase).super_JavascriptFunction.super_DynamicObject.
                super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x73])(pSVar5);
      pRVar6 = (RecyclableObject *)CONCAT44(extraout_var,iVar4);
      if (pRVar6 != (RecyclableObject *)0x0) goto LAB_00abe010;
    }
  }
  pRVar6 = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
           super_JavascriptLibraryBase).undefinedValue.ptr;
LAB_00abe010:
  pTVar2->noJsReentrancy = bVar1;
  return pRVar6;
}

Assistant:

Var JavascriptOperators::OP_LdHomeObj(Var scriptFunction, ScriptContext * scriptContext)
    {
        JIT_HELPER_NOT_REENTRANT_HEADER(LdHomeObj, reentrancylock, scriptContext->GetThreadContext());
        // Ensure this is not a stack ScriptFunction
        if (!VarIs<ScriptFunction>(scriptFunction) || ThreadContext::IsOnStack(scriptFunction))
        {
            return scriptContext->GetLibrary()->GetUndefined();
        }

        ScriptFunction *instance = UnsafeVarTo<ScriptFunction>(scriptFunction);

        // We keep a reference to the current class rather than its super prototype
        // since the prototype could change.
        Var homeObj = instance->GetHomeObj();

        return (homeObj != nullptr) ? homeObj : scriptContext->GetLibrary()->GetUndefined();
        JIT_HELPER_END(LdHomeObj);
    }